

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O3

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessMesh(MakeLeftHandedProcess *this,aiMesh *pMesh)

{
  aiVector3D *paVar1;
  aiBone *paVar2;
  long lVar3;
  ulong uVar4;
  Logger *this_00;
  uint a;
  ulong uVar5;
  uint uVar6;
  aiAnimMesh **ppaVar7;
  aiAnimMesh *paVar8;
  
  if (pMesh != (aiMesh *)0x0) {
    if (pMesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar5 = 0;
      do {
        *(uint *)((long)&pMesh->mVertices->x + lVar3) =
             *(uint *)((long)&pMesh->mVertices->x + lVar3) ^ 0x80000000;
        paVar1 = pMesh->mNormals;
        uVar6 = pMesh->mNumVertices;
        if (uVar6 != 0 && paVar1 != (aiVector3D *)0x0) {
          *(uint *)((long)&paVar1->x + lVar3) = *(uint *)((long)&paVar1->x + lVar3) ^ 0x80000000;
          uVar6 = pMesh->mNumVertices;
        }
        paVar1 = pMesh->mTangents;
        if ((paVar1 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) {
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            *(uint *)((long)&paVar1->x + lVar3) = *(uint *)((long)&paVar1->x + lVar3) ^ 0x80000000;
            *(uint *)((long)&pMesh->mBitangents->x + lVar3) =
                 *(uint *)((long)&pMesh->mBitangents->x + lVar3) ^ 0x80000000;
            uVar6 = pMesh->mNumVertices;
          }
        }
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar5 < uVar6);
    }
    uVar5 = (ulong)pMesh->mNumAnimMeshes;
    if (pMesh->mNumAnimMeshes != 0) {
      ppaVar7 = pMesh->mAnimMeshes;
      uVar4 = 0;
      do {
        paVar8 = ppaVar7[uVar4];
        if (paVar8->mNumVertices != 0) {
          lVar3 = 8;
          uVar5 = 0;
          do {
            *(uint *)((long)&paVar8->mVertices->x + lVar3) =
                 *(uint *)((long)&paVar8->mVertices->x + lVar3) ^ 0x80000000;
            ppaVar7 = pMesh->mAnimMeshes;
            paVar8 = ppaVar7[uVar4];
            paVar1 = paVar8->mNormals;
            if (paVar1 != (aiVector3D *)0x0) {
              *(uint *)((long)&paVar1->x + lVar3) = *(uint *)((long)&paVar1->x + lVar3) ^ 0x80000000
              ;
              ppaVar7 = pMesh->mAnimMeshes;
              paVar8 = ppaVar7[uVar4];
            }
            paVar1 = paVar8->mTangents;
            if (paVar1 != (aiVector3D *)0x0) {
              *(uint *)((long)&paVar1->x + lVar3) = *(uint *)((long)&paVar1->x + lVar3) ^ 0x80000000
              ;
              paVar1 = pMesh->mAnimMeshes[uVar4]->mBitangents;
              *(uint *)((long)&paVar1->x + lVar3) = *(uint *)((long)&paVar1->x + lVar3) ^ 0x80000000
              ;
              ppaVar7 = pMesh->mAnimMeshes;
              paVar8 = ppaVar7[uVar4];
            }
            uVar5 = uVar5 + 1;
            lVar3 = lVar3 + 0xc;
          } while (uVar5 < paVar8->mNumVertices);
          uVar5 = (ulong)pMesh->mNumAnimMeshes;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar5);
    }
    if (pMesh->mNumBones != 0) {
      uVar5 = 0;
      do {
        paVar2 = pMesh->mBones[uVar5];
        (paVar2->mOffsetMatrix).a3 = -(paVar2->mOffsetMatrix).a3;
        (paVar2->mOffsetMatrix).b3 = -(paVar2->mOffsetMatrix).b3;
        (paVar2->mOffsetMatrix).d3 = -(paVar2->mOffsetMatrix).d3;
        uVar4._0_4_ = (paVar2->mOffsetMatrix).c1;
        uVar4._4_4_ = (paVar2->mOffsetMatrix).c2;
        (paVar2->mOffsetMatrix).c1 = (float)(int)(uVar4 ^ 0x8000000080000000);
        (paVar2->mOffsetMatrix).c2 = (float)(int)((uVar4 ^ 0x8000000080000000) >> 0x20);
        (paVar2->mOffsetMatrix).c4 = -(paVar2->mOffsetMatrix).c4;
        uVar5 = uVar5 + 1;
      } while (uVar5 < pMesh->mNumBones);
    }
    if (((pMesh->mTangents != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
       (pMesh->mNumVertices != 0)) {
      lVar3 = 8;
      uVar5 = 0;
      do {
        paVar1 = pMesh->mBitangents;
        *(ulong *)((long)paVar1 + lVar3 + -8) =
             *(ulong *)((long)paVar1 + lVar3 + -8) ^ 0x8000000080000000;
        *(uint *)((long)&paVar1->x + lVar3) = *(uint *)((long)&paVar1->x + lVar3) ^ 0x80000000;
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar5 < pMesh->mNumVertices);
    }
    return;
  }
  this_00 = DefaultLogger::get();
  Logger::error(this_00,"Nullptr to mesh found.");
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessMesh( aiMesh* pMesh) {
    if ( nullptr == pMesh ) {
        ASSIMP_LOG_ERROR( "Nullptr to mesh found." );
        return;
    }
    // mirror positions, normals and stuff along the Z axis
    for( size_t a = 0; a < pMesh->mNumVertices; ++a)
    {
        pMesh->mVertices[a].z *= -1.0f;
        if (pMesh->HasNormals()) {
            pMesh->mNormals[a].z *= -1.0f;
        }
        if( pMesh->HasTangentsAndBitangents())
        {
            pMesh->mTangents[a].z *= -1.0f;
            pMesh->mBitangents[a].z *= -1.0f;
        }
    }

    // mirror anim meshes positions, normals and stuff along the Z axis
    for (size_t m = 0; m < pMesh->mNumAnimMeshes; ++m)
    {
        for (size_t a = 0; a < pMesh->mAnimMeshes[m]->mNumVertices; ++a)
        {
            pMesh->mAnimMeshes[m]->mVertices[a].z *= -1.0f;
            if (pMesh->mAnimMeshes[m]->HasNormals()) {
                pMesh->mAnimMeshes[m]->mNormals[a].z *= -1.0f;
            }
            if (pMesh->mAnimMeshes[m]->HasTangentsAndBitangents())
            {
                pMesh->mAnimMeshes[m]->mTangents[a].z *= -1.0f;
                pMesh->mAnimMeshes[m]->mBitangents[a].z *= -1.0f;
            }
        }
    }

    // mirror offset matrices of all bones
    for( size_t a = 0; a < pMesh->mNumBones; ++a)
    {
        aiBone* bone = pMesh->mBones[a];
        bone->mOffsetMatrix.a3 = -bone->mOffsetMatrix.a3;
        bone->mOffsetMatrix.b3 = -bone->mOffsetMatrix.b3;
        bone->mOffsetMatrix.d3 = -bone->mOffsetMatrix.d3;
        bone->mOffsetMatrix.c1 = -bone->mOffsetMatrix.c1;
        bone->mOffsetMatrix.c2 = -bone->mOffsetMatrix.c2;
        bone->mOffsetMatrix.c4 = -bone->mOffsetMatrix.c4;
    }

    // mirror bitangents as well as they're derived from the texture coords
    if( pMesh->HasTangentsAndBitangents())
    {
        for( unsigned int a = 0; a < pMesh->mNumVertices; a++)
            pMesh->mBitangents[a] *= -1.0f;
    }
}